

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGGrindReader.cpp
# Opt level: O3

void __thiscall CFGGrindReader::loadCFGs(CFGGrindReader *this)

{
  bool indirect;
  Type TVar1;
  pointer pcVar2;
  int iVar3;
  CFG *pCVar4;
  CfgNode *pCVar5;
  BlockData *this_00;
  CfgNode *src;
  Instruction *instr;
  CFG *pCVar6;
  unsigned_long_long uVar7;
  Addr AVar8;
  int size;
  Addr AVar9;
  string keyword;
  string fname;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_90;
  string *local_60;
  CfgNode *local_58;
  string local_50;
  
  if ((this->m_current).type != TKN_BRACKET_OPEN) {
LAB_0010d243:
    matchToken(this,TKN_EOF);
    CFGReader::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_90,
                    &this->super_CFGReader);
    for (; (_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
           &local_90._M_impl.super__Rb_tree_header;
        local_90._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::_Rb_tree_increment(local_90._M_impl.super__Rb_tree_header._M_header._M_left)) {
      CFG::check(*(CFG **)(local_90._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    }
    std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
    ~_Rb_tree(&local_90);
    return;
  }
  local_60 = &(this->m_current).token;
LAB_0010cd46:
  matchToken(this,TKN_BRACKET_OPEN);
  local_90._M_impl._0_8_ = &local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
  pcVar2 = (this->m_current).token._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (this->m_current).token._M_string_length);
  matchToken(this,TKN_KEYWORD);
  iVar3 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar3 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                    ,0xc3,"virtual void CFGGrindReader::loadCFGs()");
    }
    AVar8 = (this->m_current).data.addr;
    matchToken(this,TKN_ADDR);
    pCVar4 = CFGReader::instance(&this->super_CFGReader,AVar8);
    AVar8 = (this->m_current).data.addr;
    matchToken(this,TKN_ADDR);
    pCVar5 = CFG::nodeByAddr(pCVar4,AVar8);
    this_00 = (BlockData *)operator_new(0x90);
    CfgNode::BlockData::BlockData(this_00,AVar8,0,false);
    if (pCVar5 == (CfgNode *)0x0) {
      pCVar5 = (CfgNode *)operator_new(0x18);
      CfgNode::CfgNode(pCVar5,CFG_BLOCK);
      CfgNode::setData(pCVar5,(Data *)this_00);
      CFG::addNode(pCVar4,pCVar5);
    }
    else {
      if (pCVar5->m_type != CFG_PHANTOM) {
        __assert_fail("node->type() == CfgNode::CFG_PHANTOM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                      ,0x4e,"virtual void CFGGrindReader::loadCFGs()");
      }
      CfgNode::setData(pCVar5,(Data *)this_00);
    }
    if (AVar8 == pCVar4->m_addr) {
      if (pCVar4->m_entryNode != (CfgNode *)0x0) {
        __assert_fail("cfg->entryNode() == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                      ,0x53,"virtual void CFGGrindReader::loadCFGs()");
      }
      src = CFGReader::entryNode(pCVar4);
      CFG::addEdge(pCVar4,src,pCVar5,pCVar4->m_execs);
    }
    iVar3 = *(int *)&(this->m_current).data;
    local_58 = pCVar5;
    matchToken(this,TKN_NUMBER);
    matchToken(this,TKN_BRACKET_OPEN);
    while ((this->m_current).type != TKN_BRACKET_CLOSE) {
      AVar9 = (this->m_current).data.addr;
      matchToken(this,TKN_NUMBER);
      size = (int)AVar9;
      instr = Instruction::get(AVar8,size);
      CfgNode::BlockData::addInstruction(this_00,instr);
      AVar8 = AVar8 + (long)size;
    }
    matchToken(this,TKN_BRACKET_CLOSE);
    if (this_00->m_size != iVar3) {
      __assert_fail("bsize == data->size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                    ,0x68,"virtual void CFGGrindReader::loadCFGs()");
    }
    matchToken(this,TKN_BRACKET_OPEN);
    while ((this->m_current).type != TKN_BRACKET_CLOSE) {
      AVar8 = (this->m_current).data.addr;
      matchToken(this,TKN_ADDR);
      if ((this->m_current).type == TKN_COLON) {
        matchToken(this,TKN_COLON);
        uVar7 = (this->m_current).data.number;
        matchToken(this,TKN_NUMBER);
      }
      else {
        uVar7 = 0;
      }
      pCVar6 = CFGReader::instance(&this->super_CFGReader,AVar8);
      CfgNode::BlockData::addCall(this_00,pCVar6,uVar7);
    }
    matchToken(this,TKN_BRACKET_CLOSE);
    matchToken(this,TKN_BRACKET_OPEN);
    while ((this->m_current).type != TKN_BRACKET_CLOSE) {
      iVar3 = *(int *)&(this->m_current).data;
      matchToken(this,TKN_NUMBER);
      matchToken(this,TKN_ARROW);
      AVar8 = (this->m_current).data.addr;
      matchToken(this,TKN_ADDR);
      if ((this->m_current).type == TKN_COLON) {
        matchToken(this,TKN_COLON);
        uVar7 = (this->m_current).data.number;
        matchToken(this,TKN_NUMBER);
      }
      else {
        uVar7 = 0;
      }
      pCVar6 = CFGReader::instance(&this->super_CFGReader,AVar8);
      CfgNode::BlockData::addSignalHandler(this_00,iVar3,pCVar6,uVar7);
    }
    matchToken(this,TKN_BRACKET_CLOSE);
    indirect = (this->m_current).data.boolean;
    matchToken(this,TKN_BOOL);
    CfgNode::BlockData::setIndirect(this_00,indirect);
    matchToken(this,TKN_BRACKET_OPEN);
    do {
      TVar1 = (this->m_current).type;
      if (TVar1 == TKN_ADDR) {
        AVar8 = (this->m_current).data.addr;
        matchToken(this,TKN_ADDR);
        pCVar5 = CFGReader::nodeWithAddr(pCVar4,AVar8);
      }
      else {
        if (TVar1 != TKN_KEYWORD) goto LAB_0010d188;
        std::__cxx11::string::_M_assign((string *)&local_90);
        matchToken(this,TKN_KEYWORD);
        iVar3 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar3 == 0) {
          pCVar5 = CFGReader::exitNode(pCVar4);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar3 != 0) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                          ,0xaf,"virtual void CFGGrindReader::loadCFGs()");
          }
          pCVar5 = CFGReader::haltNode(pCVar4);
        }
      }
      if ((this->m_current).type == TKN_COLON) {
        matchToken(this,TKN_COLON);
        uVar7 = (this->m_current).data.number;
        matchToken(this,TKN_NUMBER);
      }
      else {
        uVar7 = 0;
      }
      CFG::addEdge(pCVar4,local_58,pCVar5,uVar7);
    } while( true );
  }
  AVar8 = (this->m_current).data.addr;
  matchToken(this,TKN_ADDR);
  if ((this->m_current).type == TKN_COLON) {
    matchToken(this,TKN_COLON);
    AVar9 = (this->m_current).data.addr;
    matchToken(this,TKN_NUMBER);
  }
  else {
    AVar9 = 0;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (this->m_current).token._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (this->m_current).token._M_string_length);
  matchToken(this,TKN_STRING);
  matchToken(this,TKN_BOOL);
  pCVar4 = CFGReader::instance(&this->super_CFGReader,AVar8);
  CFG::setFunctionName(pCVar4,&local_50);
  pCVar4->m_execs = pCVar4->m_execs + AVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  goto LAB_0010d215;
LAB_0010d188:
  if (TVar1 != TKN_BRACKET_CLOSE) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                  ,0xb4,"virtual void CFGGrindReader::loadCFGs()");
  }
  matchToken(this,TKN_BRACKET_CLOSE);
LAB_0010d215:
  matchToken(this,TKN_BRACKET_CLOSE);
  if ((_Base_ptr *)local_90._M_impl._0_8_ !=
      &local_90._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_90._M_impl._0_8_);
  }
  if ((this->m_current).type != TKN_BRACKET_OPEN) goto LAB_0010d243;
  goto LAB_0010cd46;
}

Assistant:

void CFGGrindReader::loadCFGs() {
	while (m_current.type == InputTokenizer::Lexeme::TKN_BRACKET_OPEN) {
		matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);

		std::string keyword = m_current.token;
		matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

		if (keyword == "cfg") {
			Addr addr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			unsigned long long execs = 0;
			if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
				matchToken(InputTokenizer::Lexeme::TKN_COLON);

				execs = m_current.data.number;
				matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
			}

			std::string fname = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			matchToken(InputTokenizer::Lexeme::TKN_BOOL);

			CFG* cfg = this->instance(addr);
			cfg->setFunctionName(fname);
			cfg->updateExecs(execs);
		} else if (keyword == "node") {
			Addr faddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			CFG* cfg = this->instance(faddr);

			Addr baddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			CfgNode* node = cfg->nodeByAddr(baddr);
			CfgNode::BlockData* data = new CfgNode::BlockData(baddr);
			if (node == 0) {
				node = new CfgNode(CfgNode::CFG_BLOCK);
				node->setData(data);
				cfg->addNode(node);
			} else {
				assert(node->type() == CfgNode::CFG_PHANTOM);
				node->setData(data);
			}

			if (baddr == cfg->addr()) {
				assert(cfg->entryNode() == 0);
				CfgNode* entry = CFGReader::entryNode(cfg);
				cfg->addEdge(entry, node, cfg->execs());
			}

			int bsize = m_current.data.number;
			matchToken(InputTokenizer::Lexeme::TKN_NUMBER);

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			Addr iaddr = baddr;
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				int size = m_current.data.number;
				matchToken(InputTokenizer::Lexeme::TKN_NUMBER);

				Instruction* instr = Instruction::get(iaddr, size);
				data->addInstruction(instr);

				iaddr += size;
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);

			assert(bsize == data->size());

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				Addr caddr = m_current.data.addr;
				matchToken(InputTokenizer::Lexeme::TKN_ADDR);

				unsigned long long count = 0;
				if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
					matchToken(InputTokenizer::Lexeme::TKN_COLON);

					count = m_current.data.number;
					matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
				}

				CFG* call = this->instance(caddr);
				data->addCall(call, count);
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				int sigid = m_current.data.number;
				matchToken(InputTokenizer::Lexeme::TKN_NUMBER);

				matchToken(InputTokenizer::Lexeme::TKN_ARROW);

				Addr saddr = m_current.data.addr;
				matchToken(InputTokenizer::Lexeme::TKN_ADDR);

				unsigned long long count = 0;
				if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
					matchToken(InputTokenizer::Lexeme::TKN_COLON);

					count = m_current.data.number;
					matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
				}

				CFG* handler = this->instance(saddr);
				data->addSignalHandler(sigid, handler, count);
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);

			bool indirect = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			data->setIndirect(indirect);

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				CfgNode* dst = 0;

				switch (m_current.type) {
					case InputTokenizer::Lexeme::TKN_ADDR:
						{
							Addr saddr = m_current.data.addr;
							matchToken(InputTokenizer::Lexeme::TKN_ADDR);

							dst = this->nodeWithAddr(cfg, saddr);
						}

						break;
					case InputTokenizer::Lexeme::TKN_KEYWORD:
						keyword = m_current.token;
						matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

						if (keyword == "exit")
							dst = CFGReader::exitNode(cfg);
						else if (keyword == "halt")
							dst = CFGReader::haltNode(cfg);
						else {
							// std::cout << keyword << std::endl;
							assert(false);
						}

						break;
					default:
						assert(false);
				}

				unsigned long long count = 0;
				if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
					matchToken(InputTokenizer::Lexeme::TKN_COLON);

					count = m_current.data.number;
					matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
				}

				cfg->addEdge(node, dst, count);
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);
		} else {
			assert(false);
		}

		matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);
	}

	matchToken(InputTokenizer::Lexeme::TKN_EOF);

	for (CFG* cfg : this->cfgs())
		cfg->check();
}